

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O0

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::impl::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,uint128 *value)

{
  uint128 a;
  uint128 other;
  uint128 other_00;
  uint128 a_00;
  uint128 other_01;
  uint128 a_01;
  uint128 other_02;
  uint128 a_02;
  uint128 other_03;
  uint128 other_04;
  uint128 b;
  uint128 b_00;
  uint128 b_01;
  uint128 b_02;
  uint128 b_03;
  uint128 a_03;
  bool bVar1;
  _Ios_Fmtflags _Var2;
  int_type iVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 *in_RSI;
  wistream *in_RDI;
  int pos;
  uint128 result_2;
  uint128 mult_overflow_2;
  uint128 next_digit;
  uint128 result_1;
  uint128 max;
  uint128 mult_overflow_1;
  uint128 result;
  uint128 mult_overflow;
  anon_class_1_0_00000001 hex_digit_to_uint128;
  anon_class_1_0_00000001 is_hex_basechar;
  anon_class_1_0_00000001 is_hex_digit;
  anon_class_1_0_00000001 oct_digit_to_uint128;
  anon_class_1_0_00000001 is_oct_digit;
  anon_class_1_0_00000001 dec_digit_to_uint128;
  anon_class_1_0_00000001 is_dec_digit;
  fmtflags stream_flags;
  anon_class_1_0_00000001 *in_stack_fffffffffffffe38;
  undefined2 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe42;
  undefined1 in_stack_fffffffffffffe43;
  undefined1 uVar4;
  uint128 *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  int local_16c;
  uint128 local_168;
  uint128 local_158;
  uint128 *local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  uint128 *local_118;
  uint128 *local_108;
  uint128 *local_f8;
  undefined8 local_f0;
  uint128 local_e8;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  uint128 local_b8;
  uint128 local_a8;
  uint128 local_98;
  uint128 *local_88;
  uint128 local_78;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  uint128 local_48;
  uint128 local_38;
  anon_class_1_0_00000001 local_22;
  anon_class_1_0_00000001 local_21 [2];
  anon_class_1_0_00000001 local_1f [2];
  anon_class_1_0_00000001 local_1d;
  _Ios_Fmtflags local_1c;
  undefined8 *local_18;
  wistream *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_1c = Catch::clara::std::ios_base::flags
                       ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  std::wistream::operator>>(local_10,std::ws<wchar_t,std::char_traits<wchar_t>>);
  _Var2 = Catch::clara::std::operator&(local_1c,_S_basefield);
  if (_Var2 != _S_dec) {
    if (_Var2 == _S_hex) {
      optimized_impl::uint128::uint128(&local_158,0x1000000000000000,0);
      iVar3 = std::wistream::peek();
      bVar1 = operator>><wchar_t,_std::char_traits<wchar_t>,_trng::optimized_impl::uint128>::
              anon_class_1_0_00000001::operator()(local_21,iVar3);
      if (!bVar1) {
        std::wios::setstate((int)local_10 + (int)*(undefined8 *)(*(long *)local_10 + -0x18));
        return (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)local_10;
      }
      optimized_impl::uint128::uint128(&local_168);
      local_16c = 0;
      do {
        iVar3 = std::wistream::peek();
        bVar1 = operator>><wchar_t,_std::char_traits<wchar_t>,_trng::optimized_impl::uint128>::
                anon_class_1_0_00000001::operator()(local_21,iVar3);
        uVar4 = true;
        if ((!bVar1) &&
           (in_stack_fffffffffffffe42 = false, uVar4 = in_stack_fffffffffffffe42, local_16c == 1)) {
          iVar3 = std::wistream::peek();
          in_stack_fffffffffffffe42 =
               operator>><wchar_t,_std::char_traits<wchar_t>,_trng::optimized_impl::uint128>::
               anon_class_1_0_00000001::operator()(&local_22,iVar3);
          uVar4 = in_stack_fffffffffffffe42;
        }
        if ((bool)uVar4 == false) {
          *local_18 = (undefined8)local_168.value;
          local_18[1] = local_168.value._8_8_;
          return (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)local_10;
        }
        if (local_16c == 1) {
          iVar3 = std::wistream::peek();
          bVar1 = operator>><wchar_t,_std::char_traits<wchar_t>,_trng::optimized_impl::uint128>::
                  anon_class_1_0_00000001::operator()(&local_22,iVar3);
          if (!bVar1) goto LAB_00293a7e;
          std::wistream::get();
        }
        else {
LAB_00293a7e:
          a_02.value._8_2_ = in_stack_fffffffffffffe40;
          a_02.value._0_8_ = in_stack_fffffffffffffe38;
          a_02.value._10_1_ = in_stack_fffffffffffffe42;
          a_02.value._11_1_ = uVar4;
          a_02.value._12_4_ = _Var2;
          b_03.value._8_8_ = in_stack_fffffffffffffe50;
          b_03.value._0_8_ = in_stack_fffffffffffffe48;
          bVar1 = optimized_impl::operator>=(a_02,b_03);
          if (bVar1) {
            std::wios::setstate((int)local_10 + (int)*(undefined8 *)(*(long *)local_10 + -0x18));
            return (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)local_10;
          }
          optimized_impl::uint128::uint128((uint128 *)&stack0xfffffffffffffe58,0x10);
          other_03.value._8_2_ = in_stack_fffffffffffffe40;
          other_03.value._0_8_ = in_stack_fffffffffffffe38;
          other_03.value._10_1_ = in_stack_fffffffffffffe42;
          other_03.value._11_1_ = uVar4;
          other_03.value._12_4_ = _Var2;
          optimized_impl::uint128::operator*=(&local_168,other_03);
          std::wistream::get();
          in_stack_fffffffffffffe48 =
               operator>><wchar_t,_std::char_traits<wchar_t>,_trng::optimized_impl::uint128>::
               anon_class_1_0_00000001::operator()(in_stack_fffffffffffffe38,0);
          other_04.value._8_2_ = in_stack_fffffffffffffe40;
          other_04.value._0_8_ = in_stack_fffffffffffffe38;
          other_04.value._10_1_ = in_stack_fffffffffffffe42;
          other_04.value._11_1_ = uVar4;
          other_04.value._12_4_ = _Var2;
          in_stack_fffffffffffffe50 = extraout_RDX_00;
          optimized_impl::uint128::operator+=(&local_168,other_04);
        }
        local_16c = local_16c + 1;
      } while( true );
    }
    if (_Var2 == _S_oct) {
      optimized_impl::uint128::uint128(&local_38,0x2000000000000000,0);
      iVar3 = std::wistream::peek();
      bVar1 = operator>><wchar_t,_std::char_traits<wchar_t>,_trng::optimized_impl::uint128>::
              anon_class_1_0_00000001::operator()(local_1f,iVar3);
      if (!bVar1) {
        std::wios::setstate((int)local_10 + (int)*(undefined8 *)(*(long *)local_10 + -0x18));
        return (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)local_10;
      }
      optimized_impl::uint128::uint128(&local_48);
      while( true ) {
        iVar3 = std::wistream::peek();
        bVar1 = operator>><wchar_t,_std::char_traits<wchar_t>,_trng::optimized_impl::uint128>::
                anon_class_1_0_00000001::operator()(local_1f,iVar3);
        if (!bVar1) {
          *local_18 = (undefined8)local_48.value;
          local_18[1] = local_48.value._8_8_;
          return (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)local_10;
        }
        local_58 = (undefined8)local_48.value;
        local_50 = local_48.value._8_8_;
        local_68 = (undefined8)local_38.value;
        local_60 = local_38.value._8_8_;
        a.value._8_2_ = in_stack_fffffffffffffe40;
        a.value._0_8_ = in_stack_fffffffffffffe38;
        a.value._10_1_ = in_stack_fffffffffffffe42;
        a.value._11_1_ = in_stack_fffffffffffffe43;
        a.value._12_4_ = _Var2;
        b_00.value._8_8_ = in_stack_fffffffffffffe50;
        b_00.value._0_8_ = in_stack_fffffffffffffe48;
        bVar1 = optimized_impl::operator>=(a,b_00);
        if (bVar1) break;
        optimized_impl::uint128::uint128(&local_78,8);
        other.value._8_2_ = in_stack_fffffffffffffe40;
        other.value._0_8_ = in_stack_fffffffffffffe38;
        other.value._10_1_ = in_stack_fffffffffffffe42;
        other.value._11_1_ = in_stack_fffffffffffffe43;
        other.value._12_4_ = _Var2;
        optimized_impl::uint128::operator*=(&local_48,other);
        std::wistream::get();
        local_88 = operator>><wchar_t,_std::char_traits<wchar_t>,_trng::optimized_impl::uint128>::
                   anon_class_1_0_00000001::operator()(in_stack_fffffffffffffe38,0);
        other_00.value._8_2_ = in_stack_fffffffffffffe40;
        other_00.value._0_8_ = in_stack_fffffffffffffe38;
        other_00.value._10_1_ = in_stack_fffffffffffffe42;
        other_00.value._11_1_ = in_stack_fffffffffffffe43;
        other_00.value._12_4_ = _Var2;
        optimized_impl::uint128::operator+=(&local_48,other_00);
      }
      std::wios::setstate((int)local_10 + (int)*(undefined8 *)(*(long *)local_10 + -0x18));
      return (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)local_10;
    }
  }
  optimized_impl::uint128::uint128(&local_98,0x1999999999999999,0x999999999999999a);
  optimized_impl::uint128::uint128(&local_a8,0xffffffffffffffff,0xffffffffffffffff);
  iVar3 = std::wistream::peek();
  bVar1 = operator>><wchar_t,_std::char_traits<wchar_t>,_trng::optimized_impl::uint128>::
          anon_class_1_0_00000001::operator()(&local_1d,iVar3);
  if (!bVar1) {
    std::wios::setstate((int)local_10 + (int)*(undefined8 *)(*(long *)local_10 + -0x18));
    return (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)local_10;
  }
  optimized_impl::uint128::uint128(&local_b8);
  while( true ) {
    iVar3 = std::wistream::peek();
    bVar1 = operator>><wchar_t,_std::char_traits<wchar_t>,_trng::optimized_impl::uint128>::
            anon_class_1_0_00000001::operator()(&local_1d,iVar3);
    if (!bVar1) {
      *local_18 = (undefined8)local_b8.value;
      local_18[1] = local_b8.value._8_8_;
      return (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)local_10;
    }
    local_c8 = (undefined8)local_b8.value;
    local_c0 = local_b8.value._8_8_;
    local_d8 = (undefined8)local_98.value;
    local_d0 = local_98.value._8_8_;
    a_00.value._8_2_ = in_stack_fffffffffffffe40;
    a_00.value._0_8_ = in_stack_fffffffffffffe38;
    a_00.value._10_1_ = in_stack_fffffffffffffe42;
    a_00.value._11_1_ = in_stack_fffffffffffffe43;
    a_00.value._12_4_ = _Var2;
    b_01.value._8_8_ = in_stack_fffffffffffffe50;
    b_01.value._0_8_ = in_stack_fffffffffffffe48;
    bVar1 = optimized_impl::operator>=(a_00,b_01);
    if (bVar1) break;
    optimized_impl::uint128::uint128(&local_e8,10);
    other_01.value._8_2_ = in_stack_fffffffffffffe40;
    other_01.value._0_8_ = in_stack_fffffffffffffe38;
    other_01.value._10_1_ = in_stack_fffffffffffffe42;
    other_01.value._11_1_ = in_stack_fffffffffffffe43;
    other_01.value._12_4_ = _Var2;
    optimized_impl::uint128::operator*=(&local_b8,other_01);
    std::wistream::get();
    local_108 = operator>><wchar_t,_std::char_traits<wchar_t>,_trng::optimized_impl::uint128>::
                anon_class_1_0_00000001::operator()(in_stack_fffffffffffffe38,0);
    local_128 = (undefined8)local_a8.value;
    local_120 = local_a8.value._8_8_;
    local_138 = (undefined8)local_b8.value;
    local_130 = local_b8.value._8_8_;
    a_03.value._8_8_ = in_stack_fffffffffffffe58;
    a_03.value._0_8_ = in_stack_fffffffffffffe50;
    b.value._2_1_ = in_stack_fffffffffffffe42;
    b.value._0_2_ = in_stack_fffffffffffffe40;
    b.value._3_1_ = in_stack_fffffffffffffe43;
    b.value._4_4_ = _Var2;
    b.value._8_8_ = in_stack_fffffffffffffe48;
    local_f8 = local_108;
    local_f0 = extraout_RDX;
    local_118 = optimized_impl::operator-(a_03,b);
    a_01.value._8_2_ = in_stack_fffffffffffffe40;
    a_01.value._0_8_ = in_stack_fffffffffffffe38;
    a_01.value._10_1_ = in_stack_fffffffffffffe42;
    a_01.value._11_1_ = in_stack_fffffffffffffe43;
    a_01.value._12_4_ = _Var2;
    b_02.value._8_8_ = in_stack_fffffffffffffe50;
    b_02.value._0_8_ = in_stack_fffffffffffffe48;
    bVar1 = optimized_impl::operator>(a_01,b_02);
    if (bVar1) {
      std::wios::setstate((int)local_10 + (int)*(undefined8 *)(*(long *)local_10 + -0x18));
      return (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)local_10;
    }
    local_148 = local_f8;
    local_140 = local_f0;
    other_02.value._8_2_ = in_stack_fffffffffffffe40;
    other_02.value._0_8_ = in_stack_fffffffffffffe38;
    other_02.value._10_1_ = in_stack_fffffffffffffe42;
    other_02.value._11_1_ = in_stack_fffffffffffffe43;
    other_02.value._12_4_ = _Var2;
    optimized_impl::uint128::operator+=(&local_b8,other_02);
  }
  std::wios::setstate((int)local_10 + (int)*(undefined8 *)(*(long *)local_10 + -0x18));
  return (basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)local_10;
}

Assistant:

std::basic_istream<T,
        TRAIT> &operator>>(std::basic_istream<T,
        TRAIT> &in, UINT128 &value) {
      const auto stream_flags{in.flags()};

      const auto is_dec_digit = [](typename TRAIT::int_type c) -> bool {
        return T('0') <= c and c <= T('9');
      };
      const auto dec_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
      };

      const auto is_oct_digit = [](typename TRAIT::int_type c) -> bool {
        return T('0') <= c and c <= T('7');
      };
      const auto oct_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
      };

      const auto is_hex_digit = [](typename TRAIT::int_type c) -> bool {
        return (T('0') <= c and c <= T('9')) or (T('a') <= c and c <= T('f')) or
               (T('A') <= c and c <= T('F'));
      };
      const auto is_hex_basechar = [](typename TRAIT::int_type c) -> bool {
        return c == T('x') or c == T('X');
      };
      const auto hex_digit_to_uint128 = [](typename TRAIT::int_type c) -> UINT128 {
        if (T('0') <= c and c <= T('9'))
          return static_cast<UINT128>(
              static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('0')));
        if (T('a') <= c and c <= T('f'))
          return static_cast<UINT128>(
              static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('a') + 10));
        return static_cast<UINT128>(
            static_cast<std::uint64_t>(c - static_cast<typename TRAIT::int_type>('A') + 10));
      };

      in >> std::ws;

      switch (stream_flags & std::ios_base::basefield) {
        case std::ios_base::oct: {
          const UINT128 mult_overflow{0x2000000000000000, 0x000000000000000};  // 2^128 / 8
          if (not is_oct_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          while (is_oct_digit(in.peek())) {
            if (result >= mult_overflow) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result *= static_cast<UINT128>(static_cast<std::uint64_t>(8));
            result += oct_digit_to_uint128(in.get());
          }
          value = result;
        }
          break;
        case std::ios_base::dec:
        default: {
          const UINT128 mult_overflow{0x1999999999999999,
                                      0x999999999999999a};  // ceil(2^128 / 10)
          const UINT128 max{0xffffffffffffffff, 0xffffffffffffffff};  // 2^128 - 1
          if (not is_dec_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          while (is_dec_digit(in.peek())) {
            if (result >= mult_overflow) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result *= static_cast<UINT128>(static_cast<std::uint64_t>(10));
            const auto next_digit{dec_digit_to_uint128(in.get())};
            if (next_digit > max - result) {
              in.setstate(std::ios_base::failbit);
              return in;
            }
            result += next_digit;
          }
          value = result;
        }
          break;
        case std::ios_base::hex: {
          const UINT128 mult_overflow{0x1000000000000000, 0x000000000000000};  // 2^128 / 16
          if (not is_hex_digit(in.peek())) {
            in.setstate(std::ios_base::failbit);
            return in;
          }
          UINT128 result;
          int pos{0};
          while (is_hex_digit(in.peek()) or (pos == 1 and is_hex_basechar(in.peek()))) {
            if (pos == 1 and is_hex_basechar(in.peek())) {
              in.get();
            } else {
              if (result >= mult_overflow) {
                in.setstate(std::ios_base::failbit);
                return in;
              }
              result *= static_cast<UINT128>(static_cast<std::uint64_t>(16));
              result += hex_digit_to_uint128(in.get());
            }
            ++pos;
          }
          value = result;
        }
          break;
      }

      return in;
    }